

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

void __thiscall wirehair::Codec::BackSubstituteAboveDiagonal(Codec *this)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  PeelColumn *pPVar4;
  uint64_t *puVar5;
  uint16_t *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint8_t *puVar13;
  ushort *puVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ushort uVar19;
  uint uVar21;
  uint uVar22;
  uint8_t *puVar23;
  int iVar24;
  ulong uVar25;
  uint8_t *vy;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  uint8_t *win_table [128];
  uint local_4c0;
  ulong local_4b8;
  uint local_49c;
  ulong local_488;
  uint8_t *local_430 [2];
  void *local_420;
  uint8_t *local_418;
  void *local_410;
  void *local_408;
  void *local_400;
  uint8_t *local_3f8 [8];
  uint8_t *local_3b8 [16];
  uint8_t *local_338 [32];
  uint8_t *local_238 [64];
  undefined8 uStack_38;
  uint uVar20;
  
  uVar19 = this->_dense_count + this->_defer_count;
  uVar20 = (uint)uVar19;
  uVar26 = (this->_defer_count - 1) + (uint)this->_mix_count;
  uVar16 = (ulong)uVar26;
  uVar3 = this->_first_heavy_column;
  uVar10 = (ulong)uVar3;
  if (0x2c < uVar26) {
    uVar1 = this->_block_count;
    local_49c = 0x2d;
    if (uVar26 >= 0x46) {
      local_49c = 0x46;
    }
    uVar21 = 7;
    if (uVar26 < 0x87) {
      uVar21 = 6 - (uVar26 < 0x46);
    }
    uVar7 = 1;
    if (uVar26 >= 0x87) {
      local_49c = 0x87;
    }
    uVar26 = 1 << (uVar21 & 0x1f);
    if (uVar1 != 0) {
      puVar13 = this->_recovery_blocks;
      pPVar4 = this->_peel_cols;
      uVar12 = this->_block_bytes;
      lVar18 = 0;
      do {
        if ((&pPVar4->Mark)[lVar18] == '\x01') {
          uVar28 = (ulong)uVar7;
          uVar7 = uVar7 + 1;
          local_430[uVar28 - 1] = puVar13;
          if (uVar26 <= uVar7) break;
        }
        puVar13 = puVar13 + uVar12;
        lVar18 = lVar18 + 6;
      } while ((uint)uVar1 * 6 != (int)lVar18);
    }
    if (uVar26 <= uVar7) {
      do {
        uVar7 = ((int)uVar16 - uVar21) + 1;
        uVar28 = uVar16;
        do {
          uVar9 = (uint)uVar28;
          uVar27 = uVar9 - uVar21;
          uVar16 = (ulong)uVar27;
          uVar12 = uVar27 + 1;
          uVar11 = (ulong)uVar12;
          if (uVar12 < uVar9) {
            local_4b8 = 1L << (uVar28 & 0x3f);
            do {
              local_4c0 = (uint)uVar19;
              puVar13 = this->_recovery_blocks +
                        (uint)this->_ge_col_map[uVar28] * this->_block_bytes;
              if ((uVar10 <= uVar28 && uVar19 <= this->_pivots[uVar28]) &&
                 ((ulong)this->_heavy_matrix
                         [(this->_pivots[uVar28] - local_4c0 & 0xffff) * this->_heavy_pitch +
                          ((int)uVar28 - uVar3)] != 1)) {
                gf256_mul_mem(puVar13,puVar13,
                              GF256Ctx.GF256_INV_TABLE
                              [this->_heavy_matrix
                               [(this->_pivots[uVar28] - local_4c0 & 0xffff) * this->_heavy_pitch +
                                ((int)uVar28 - uVar3)]],this->_block_bytes);
              }
              puVar5 = this->_ge_matrix;
              uVar17 = (ulong)uVar7;
              do {
                uVar25 = uVar17 + 1;
                uVar1 = this->_pivots[uVar17];
                if ((uVar1 < uVar19) || (uVar28 < uVar10)) {
                  if ((*(ulong *)((long)puVar5 +
                                 (ulong)((uint)uVar1 * this->_ge_pitch) * 8 +
                                 (ulong)(((uint)(uVar28 >> 6) & 0x3ffffff) << 3)) & local_4b8) != 0)
                  {
                    gf256_add_mem(this->_recovery_blocks +
                                  (uint)this->_ge_col_map[uVar17] * this->_block_bytes,puVar13,
                                  this->_block_bytes);
                  }
                }
                else if (this->_heavy_matrix
                         [(uVar1 - uVar20) * this->_heavy_pitch + ((int)uVar28 - uVar3)] != '\0') {
                  gf256_muladd_mem(this->_recovery_blocks +
                                   (uint)this->_ge_col_map[uVar17] * this->_block_bytes,
                                   this->_heavy_matrix
                                   [(uVar1 - uVar20) * this->_heavy_pitch + ((int)uVar28 - uVar3)],
                                   puVar13,this->_block_bytes);
                }
                uVar17 = uVar25;
              } while ((uVar25 & 0xffffffff) != uVar28);
              uVar28 = uVar28 - 1;
              local_4b8 = local_4b8 >> 1 | local_4b8 << 0x3f;
            } while (uVar12 < (uint)uVar28);
          }
          if ((uVar3 <= uVar12 && uVar19 <= this->_pivots[uVar11]) &&
             ((ulong)this->_heavy_matrix
                     [(uVar12 - uVar3) + (this->_pivots[uVar11] - uVar20) * this->_heavy_pitch] != 1
             )) {
            gf256_mul_mem(this->_recovery_blocks +
                          (uint)this->_ge_col_map[uVar11] * this->_block_bytes,
                          this->_recovery_blocks +
                          (uint)this->_ge_col_map[uVar11] * this->_block_bytes,
                          GF256Ctx.GF256_INV_TABLE
                          [this->_heavy_matrix
                           [(uVar12 - uVar3) + (this->_pivots[uVar11] - uVar20) * this->_heavy_pitch
                           ]],this->_block_bytes);
          }
          uVar15 = this->_block_bytes;
          puVar23 = this->_recovery_blocks + this->_ge_col_map[uVar11] * uVar15;
          vy = this->_recovery_blocks + this->_ge_col_map[uVar27 + 2] * uVar15;
          local_430[0] = puVar23;
          local_430[1] = vy;
          gf256_addset_mem(local_420,puVar23,vy,uVar15);
          puVar13 = this->_recovery_blocks +
                    (uint)this->_ge_col_map[uVar27 + 3] * this->_block_bytes;
          local_418 = puVar13;
          gf256_addset_mem(local_410,puVar23,puVar13,this->_block_bytes);
          gf256_addset_mem(local_408,vy,puVar13,this->_block_bytes);
          gf256_addset_mem(local_400,puVar23,local_408,this->_block_bytes);
          lVar18 = -7;
          uVar1 = this->_ge_col_map[uVar27 + 4];
          uVar15 = this->_block_bytes;
          puVar13 = this->_recovery_blocks;
          local_3f8[0] = puVar13 + uVar1 * uVar15;
          do {
            gf256_addset_mem(local_3b8[lVar18],local_3f8[lVar18],puVar13 + uVar1 * uVar15,
                             this->_block_bytes);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 0);
          if (4 < uVar21) {
            lVar18 = -0xf;
            uVar1 = this->_ge_col_map[uVar27 + 5];
            uVar15 = this->_block_bytes;
            puVar13 = this->_recovery_blocks;
            local_3b8[0] = puVar13 + uVar1 * uVar15;
            do {
              gf256_addset_mem(local_338[lVar18],local_3b8[lVar18],puVar13 + uVar1 * uVar15,
                               this->_block_bytes);
              lVar18 = lVar18 + 1;
            } while (lVar18 != 0);
            if (uVar21 != 5) {
              lVar18 = -0x1f;
              uVar1 = this->_ge_col_map[uVar27 + 6];
              uVar15 = this->_block_bytes;
              puVar13 = this->_recovery_blocks;
              local_338[0] = puVar13 + uVar1 * uVar15;
              do {
                gf256_addset_mem(local_238[lVar18],local_338[lVar18],puVar13 + uVar1 * uVar15,
                                 this->_block_bytes);
                lVar18 = lVar18 + 1;
              } while (lVar18 != 0);
              if (6 < uVar21) {
                lVar18 = -0x3f;
                uVar1 = this->_ge_col_map[uVar27 + 7];
                uVar15 = this->_block_bytes;
                puVar13 = this->_recovery_blocks;
                local_238[0] = puVar13 + uVar1 * uVar15;
                do {
                  gf256_addset_mem((void *)(&uStack_38)[lVar18],local_238[lVar18],
                                   puVar13 + uVar1 * uVar15,this->_block_bytes);
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 0);
              }
            }
          }
          uVar15 = 0x7fff;
          if (uVar9 < uVar3) {
LAB_00106389:
            puVar6 = this->_pivots;
            uVar22 = uVar12 >> 6;
            uVar8 = uVar12 & 0x3f;
            if (uVar22 == uVar9 >> 6) {
              if (uVar12 != 0) {
                uVar28 = 0;
                do {
                  uVar1 = puVar6[uVar28];
                  if ((uVar1 < uVar15) &&
                     (uVar9 = (uint)(this->_ge_matrix
                                     [(ulong)uVar22 + (ulong)((uint)uVar1 * this->_ge_pitch)] >>
                                    uVar8) & uVar26 - 1, uVar9 != 0)) {
                    gf256_add_mem(this->_recovery_blocks +
                                  (uint)this->_ge_col_map[uVar28 & 0xffff] * this->_block_bytes,
                                  local_430[(ulong)uVar9 - 1],this->_block_bytes);
                  }
                  uVar28 = uVar28 + 1;
                } while (((uint)uVar28 & 0xffff) < uVar12);
              }
            }
            else if (uVar12 != 0) {
              uVar28 = 0;
              do {
                uVar1 = puVar6[uVar28];
                if ((uVar1 < uVar15) &&
                   (uVar11 = (ulong)((uint)uVar1 * this->_ge_pitch),
                   uVar9 = ((uint)(this->_ge_matrix[(ulong)uVar22 + uVar11 + 1] <<
                                  ((ulong)(0x40 - uVar8) & 0x3f)) |
                           (uint)(this->_ge_matrix[uVar22 + uVar11] >> (ulong)uVar8)) & uVar26 - 1,
                   uVar9 != 0)) {
                  gf256_add_mem(this->_recovery_blocks +
                                (uint)this->_ge_col_map[uVar28 & 0xffff] * this->_block_bytes,
                                local_430[(ulong)uVar9 - 1],this->_block_bytes);
                }
                uVar28 = uVar28 + 1;
              } while (((uint)uVar28 & 0xffff) < uVar12);
            }
          }
          else if (uVar12 != 0) {
            puVar14 = this->_pivots;
            local_488 = 0;
            do {
              uVar1 = *puVar14;
              if (uVar19 <= uVar1) {
                uVar2 = this->_ge_col_map[local_488];
                uVar15 = this->_block_bytes;
                puVar13 = this->_recovery_blocks;
                uVar28 = (ulong)uVar12;
                if (uVar12 < uVar3) {
                  uVar22 = this->_ge_pitch;
                  puVar5 = this->_ge_matrix;
                  uVar17 = 1L << ((ulong)uVar12 & 0x3f);
                  uVar25 = uVar11;
                  iVar24 = uVar3 - uVar12;
                  do {
                    if ((puVar5[(ulong)(uVar22 * uVar1) + (uVar25 >> 6 & 0x3ffffff)] & uVar17) != 0)
                    {
                      gf256_add_mem(puVar13 + uVar2 * uVar15,
                                    this->_recovery_blocks +
                                    (uint)this->_ge_col_map[uVar25] * this->_block_bytes,
                                    this->_block_bytes);
                    }
                    uVar25 = uVar25 + 1;
                    uVar17 = uVar17 >> 0x3f | uVar17 << 1;
                    iVar24 = iVar24 + -1;
                    uVar28 = uVar10;
                  } while (iVar24 != 0);
                }
                if ((uint)uVar28 <= uVar9) {
                  puVar23 = this->_heavy_matrix +
                            ((uVar1 - uVar20) * this->_heavy_pitch + ((uint)uVar28 - uVar3));
                  do {
                    if (*puVar23 != '\0') {
                      gf256_muladd_mem(puVar13 + uVar2 * uVar15,*puVar23,
                                       this->_recovery_blocks +
                                       (uint)this->_ge_col_map[uVar28] * this->_block_bytes,
                                       this->_block_bytes);
                    }
                    puVar23 = puVar23 + 1;
                    uVar22 = (int)uVar28 + 1;
                    uVar28 = (ulong)uVar22;
                  } while (uVar22 <= uVar9);
                }
              }
              local_488 = local_488 + 1;
              puVar14 = puVar14 + 1;
              uVar15 = uVar20;
            } while (local_488 != uVar11);
            goto LAB_00106389;
          }
          uVar7 = uVar7 - uVar21;
          uVar28 = uVar16;
        } while (local_49c <= uVar27);
        if (uVar27 < 0x46) {
          if (uVar27 < 0x2d) {
            if (uVar27 < 0x18) break;
            uVar21 = 4;
            local_49c = 0x18;
          }
          else {
            uVar21 = 5;
            local_49c = 0x2d;
          }
        }
        else {
          uVar21 = 6;
          local_49c = 0x46;
        }
        uVar26 = 1 << uVar21;
      } while( true );
    }
  }
  local_4b8 = 1L << (uVar16 & 0x3f);
  while( true ) {
    puVar13 = this->_recovery_blocks + (uint)this->_ge_col_map[uVar16] * this->_block_bytes;
    if ((uVar10 <= uVar16 && uVar19 <= this->_pivots[uVar16]) &&
       ((ulong)this->_heavy_matrix
               [(this->_pivots[uVar16] - uVar20) * this->_heavy_pitch + ((int)uVar16 - uVar3)] != 1)
       ) {
      gf256_mul_mem(puVar13,puVar13,
                    GF256Ctx.GF256_INV_TABLE
                    [this->_heavy_matrix
                     [(this->_pivots[uVar16] - uVar20) * this->_heavy_pitch + ((int)uVar16 - uVar3)]
                    ],this->_block_bytes);
    }
    if (uVar16 == 0) break;
    uVar28 = 0;
    puVar5 = this->_ge_matrix;
    do {
      uVar1 = this->_pivots[uVar28];
      if (uVar28 < uVar10 || uVar1 < uVar19) {
        if ((*(ulong *)((long)puVar5 +
                       (ulong)((uint)uVar1 * this->_ge_pitch) * 8 +
                       (ulong)(((uint)(uVar16 >> 6) & 0x3ffffff) << 3)) & local_4b8) != 0) {
          gf256_add_mem(this->_recovery_blocks +
                        (uint)this->_ge_col_map[uVar28] * this->_block_bytes,puVar13,
                        this->_block_bytes);
        }
      }
      else if (this->_heavy_matrix[(uVar1 - uVar20) * this->_heavy_pitch + ((int)uVar16 - uVar3)] !=
               '\0') {
        gf256_muladd_mem(this->_recovery_blocks +
                         (uint)this->_ge_col_map[uVar28] * this->_block_bytes,
                         this->_heavy_matrix
                         [(uVar1 - uVar20) * this->_heavy_pitch + ((int)uVar16 - uVar3)],puVar13,
                         this->_block_bytes);
      }
      uVar28 = uVar28 + 1;
    } while (uVar16 != uVar28);
    local_4b8 = local_4b8 >> 1 | local_4b8 << 0x3f;
    uVar16 = uVar16 - 1;
  }
  return;
}

Assistant:

void Codec::BackSubstituteAboveDiagonal()
{
    CAT_IF_DUMP(cout << endl << "---- BackSubstituteAboveDiagonal ----" << endl << endl;)

    CAT_IF_ROWOP(unsigned rowops = 0; unsigned heavyops = 0;)

    const unsigned pivot_count = _defer_count + _mix_count;
    unsigned pivot_i = pivot_count - 1;
    const uint16_t first_heavy_row = _defer_count + _dense_count;
    const unsigned first_heavy_column = _first_heavy_column;

#if defined(CAT_WINDOWED_BACKSUB)
    // Build temporary storage space if windowing is to be used
    if (pivot_i >= CAT_ABOVE_WIN_THRESH_5)
    {
        // Calculate initial window size
        unsigned w, next_check_i;
        if (pivot_i >= CAT_ABOVE_WIN_THRESH_7) {
            w = 7;
            next_check_i = CAT_ABOVE_WIN_THRESH_7;
        }
        else if (pivot_i >= CAT_ABOVE_WIN_THRESH_6) {
            w = 6;
            next_check_i = CAT_ABOVE_WIN_THRESH_6;
        }
        else if (pivot_i >= CAT_ABOVE_WIN_THRESH_5) {
            w = 5;
            next_check_i = CAT_ABOVE_WIN_THRESH_5;
        }
        else {
            w = 4;
            next_check_i = CAT_ABOVE_WIN_THRESH_4;
        }
        uint32_t win_lim = 1 << w;

        CAT_IF_DUMP(cout << "Activating windowed back-substitution with initial window " << w << endl;)

        // Use the first few peel column values as window table space
        // NOTE: The peeled column values were previously used up until this point,
        // but now they are unused, and so they can be reused for temporary space.
        uint8_t * GF256_RESTRICT win_table[128];
        const PeelColumn * GF256_RESTRICT column = _peel_cols;
        uint8_t * GF256_RESTRICT column_src = _recovery_blocks;
        uint32_t jj = 1;

        // For each original data column:
        for (unsigned count = _block_count; count > 0; --count, ++column, column_src += _block_bytes)
        {
            // If column is peeled:
            if (column->Mark == MARK_PEEL)
            {
                // Reuse the block value temporarily as window table space
                win_table[jj] = column_src;

                CAT_IF_DUMP(cout << "-- Window table entry " << jj << " set to column " << _block_count - count << endl;)

                // If done:
                if (++jj >= win_lim) {
                    break;
                }
            }
        }

        CAT_IF_DUMP(if (jj < win_lim) {
            cout << "!! Not enough space in peeled columns to generate a table.  " \
                "Going back to normal back-substitute." << endl;
        })

        // If enough space was found:
        if (jj >= win_lim) for (;;)
        {
            // Calculate first column in window
            const unsigned backsub_i = pivot_i - w + 1;

            CAT_IF_DUMP(cout << "-- Windowing from " << backsub_i << " to " << pivot_i << " (inclusive)" << endl;)

            // Eliminate upper triangular part above windowed bits:

            // For each column:
            uint64_t ge_mask = (uint64_t)1 << (pivot_i & 63);
            for (unsigned src_pivot_i = pivot_i; src_pivot_i > backsub_i; --src_pivot_i)
            {
                CAT_DEBUG_ASSERT(_ge_col_map[src_pivot_i] < _recovery_rows);
                uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * _ge_col_map[src_pivot_i];

                const uint16_t ge_row_i = _pivots[src_pivot_i];

                // If diagonal element is heavy:
                if (ge_row_i >= first_heavy_row &&
                    src_pivot_i >= first_heavy_column)
                {
                    // Look up row value
                    CAT_DEBUG_ASSERT(ge_row_i >= first_heavy_row);
                    uint16_t heavy_row_i = ge_row_i - first_heavy_row;
                    CAT_DEBUG_ASSERT(src_pivot_i >= first_heavy_column);
                    unsigned heavy_col_i = src_pivot_i - first_heavy_column;
                    CAT_DEBUG_ASSERT(heavy_col_i < _heavy_columns);
                    CAT_DEBUG_ASSERT(heavy_row_i < _heavy_rows);
                    const uint8_t code_value = _heavy_matrix[_heavy_pitch * heavy_row_i + heavy_col_i];

                    // Normalize code value, setting it to 1 (implicitly nonzero)
                    if (code_value != 1) {
                        gf256_div_mem(src, src, code_value, _block_bytes);
                        CAT_IF_ROWOP(++heavyops;)
                    }

                    CAT_IF_DUMP(cout << "Normalized diagonal for heavy pivot " << pivot_i << endl;)
                }

                CAT_IF_DUMP(cout << "Back-substituting small triangle from pivot " << src_pivot_i << "[" << (unsigned)src[0] << "] :";)

                uint64_t * GF256_RESTRICT ge_row = _ge_matrix + (src_pivot_i >> 6);

                // For each row above the diagonal:
                for (unsigned dest_pivot_i = backsub_i; dest_pivot_i < src_pivot_i; ++dest_pivot_i)
                {
                    const uint16_t dest_row_i = _pivots[dest_pivot_i];

                    // If row is heavy:
                    if (dest_row_i >= first_heavy_row && src_pivot_i >= first_heavy_column)
                    {
                        CAT_DEBUG_ASSERT(dest_row_i >= first_heavy_row);
                        const unsigned heavy_row_i = dest_row_i - first_heavy_row;
                        CAT_DEBUG_ASSERT(src_pivot_i >= first_heavy_column);
                        const unsigned heavy_col_i = src_pivot_i - first_heavy_column;
                        const uint8_t code_value = _heavy_matrix[_heavy_pitch * heavy_row_i + heavy_col_i];

                        // If column is zero:
                        if (0 == code_value) {
                            continue; // Skip it
                        }

                        CAT_DEBUG_ASSERT(_ge_col_map[dest_pivot_i] < _recovery_rows);
                        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[dest_pivot_i];

                        // Back-substitute
                        gf256_muladd_mem(dest, code_value, src, _block_bytes);

                        CAT_IF_ROWOP(if (code_value == 1) ++rowops; else ++heavyops;)
                        CAT_IF_DUMP(cout << " h" << dest_pivot_i;)
                    }
                    else
                    {
                        // If bit is set in that row:
                        if (ge_row[_ge_pitch * dest_row_i] & ge_mask)
                        {
                            CAT_DEBUG_ASSERT(_ge_col_map[dest_pivot_i] < _recovery_rows);
                            uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[dest_pivot_i];

                            // Back-substitute
                            gf256_add_mem(dest, src, _block_bytes);

                            CAT_IF_ROWOP(++rowops;)
                            CAT_IF_DUMP(cout << " " << dest_pivot_i;)
                        }
                    }
                } // next pivot above

                ge_mask = CAT_ROR64(ge_mask, 1);

                CAT_IF_DUMP(cout << endl;)
            } // next pivot

            // Normalize the final diagonal element
            const uint16_t ge_row_i = _pivots[backsub_i];

            // If this is a heavy row and column:
            if (ge_row_i >= first_heavy_row &&
                backsub_i >= first_heavy_column)
            {
                CAT_DEBUG_ASSERT(ge_row_i >= first_heavy_row);
                CAT_DEBUG_ASSERT(backsub_i >= first_heavy_column);
                const unsigned heavy_row_i = ge_row_i - first_heavy_row;
                const unsigned heavy_col_i = backsub_i - first_heavy_column;
                CAT_DEBUG_ASSERT(heavy_col_i < _heavy_columns);
                CAT_DEBUG_ASSERT(heavy_row_i < _heavy_rows);

                // Look up row value
                const uint8_t code_value = _heavy_matrix[_heavy_pitch * heavy_row_i + heavy_col_i];

                // Divide by this code value (implicitly nonzero)
                if (code_value != 1)
                {
                    CAT_DEBUG_ASSERT(_ge_col_map[backsub_i] < _recovery_rows);
                    uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i];

                    gf256_div_mem(src, src, code_value, _block_bytes);
                    CAT_IF_ROWOP(++heavyops;)
                }
            }

            CAT_IF_DUMP(cout << "-- Generating window table with " << w << " bits" << endl;)

            // Generate window table: 2 bits
            CAT_DEBUG_ASSERT(_ge_col_map[backsub_i] < _recovery_rows);
            win_table[1] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i];
            CAT_DEBUG_ASSERT(_ge_col_map[backsub_i + 1] < _recovery_rows);
            win_table[2] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i + 1];
            gf256_addset_mem(win_table[3], win_table[1], win_table[2], _block_bytes);
            CAT_IF_ROWOP(++rowops;)

            // Generate window table: 3 bits
            CAT_DEBUG_ASSERT(_ge_col_map[backsub_i + 2] < _recovery_rows);
            win_table[4] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i + 2];
            gf256_addset_mem(win_table[5], win_table[1], win_table[4], _block_bytes);
            gf256_addset_mem(win_table[6], win_table[2], win_table[4], _block_bytes);
            gf256_addset_mem(win_table[7], win_table[1], win_table[6], _block_bytes);
            CAT_IF_ROWOP(rowops += 3;)

            // Generate window table: 4 bits
            CAT_DEBUG_ASSERT(_ge_col_map[backsub_i + 3] < _recovery_rows);
            win_table[8] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i + 3];
            for (unsigned ii = 1; ii < 8; ++ii) {
                gf256_addset_mem(win_table[8 + ii], win_table[ii], win_table[8], _block_bytes);
            }
            CAT_IF_ROWOP(rowops += 7;)

            // Generate window table: 5+ bits
            if (w >= 5)
            {
                CAT_DEBUG_ASSERT(_ge_col_map[backsub_i + 4] < _recovery_rows);
                win_table[16] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i + 4];
                for (unsigned ii = 1; ii < 16; ++ii) {
                    gf256_addset_mem(win_table[16 + ii], win_table[ii], win_table[16], _block_bytes);
                }
                CAT_IF_ROWOP(rowops += 15;)

                if (w >= 6)
                {
                    CAT_DEBUG_ASSERT(_ge_col_map[backsub_i + 5] < _recovery_rows);
                    win_table[32] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i + 5];
                    for (unsigned ii = 1; ii < 32; ++ii) {
                        gf256_addset_mem(win_table[32 + ii], win_table[ii], win_table[32], _block_bytes);
                    }
                    CAT_IF_ROWOP(rowops += 31;)

                    if (w >= 7)
                    {
                        CAT_DEBUG_ASSERT(_ge_col_map[backsub_i + 6] < _recovery_rows);
                        win_table[64] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i + 6];
                        for (unsigned ii = 1; ii < 64; ++ii) {
                            gf256_addset_mem(win_table[64 + ii], win_table[ii], win_table[64], _block_bytes);
                        }
                        CAT_IF_ROWOP(rowops += 63;)
                    }
                }
            }

            // If a row above the window may be heavy:
            if (pivot_i >= first_heavy_column)
            {
                const uint16_t * GF256_RESTRICT pivot_row = _pivots;

                // For each pivot in the window:
                for (unsigned ge_above_i = 0; ge_above_i < backsub_i; ++ge_above_i)
                {
                    const unsigned ge_row_k = *pivot_row++;

                    // If row is not heavy:
                    if (ge_row_k < first_heavy_row) {
                        continue; // Skip it
                    }

                    CAT_DEBUG_ASSERT(_ge_col_map[ge_above_i] < _recovery_rows);
                    uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[ge_above_i];
                    unsigned ge_column_j = backsub_i;

                    // If the first column of window is not heavy:
                    if (ge_column_j < first_heavy_column)
                    {
                        uint64_t ge_mask2 = (uint64_t)1 << (ge_column_j & 63);
                        const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + _ge_pitch * ge_row_k;

                        // For each non-heavy column in the extra row:
                        for (; ge_column_j < first_heavy_column && ge_column_j <= pivot_i; ++ge_column_j)
                        {
                            const uint64_t ge_word = ge_row[ge_column_j >> 6];
                            const bool nonzero = 0 != (ge_word & ge_mask2);

                            // If column is non-zero:
                            if (nonzero)
                            {
                                CAT_DEBUG_ASSERT(_ge_col_map[ge_column_j] < _recovery_rows);
                                const uint8_t *src = _recovery_blocks + _block_bytes * _ge_col_map[ge_column_j];

                                gf256_add_mem(dest, src, _block_bytes);

                                CAT_IF_ROWOP(++rowops;)
                            }

                            ge_mask2 = CAT_ROL64(ge_mask2, 1);
                        }
                    }

                    CAT_DEBUG_ASSERT(ge_row_k >= first_heavy_row);
                    CAT_DEBUG_ASSERT(ge_column_j >= first_heavy_column);
                    const unsigned heavy_row_i = ge_row_k - first_heavy_row;
                    const unsigned heavy_col_j = ge_column_j - first_heavy_column;
                    CAT_DEBUG_ASSERT(heavy_col_j < _heavy_columns);
                    CAT_DEBUG_ASSERT(heavy_row_i < _heavy_rows);

                    const uint8_t * GF256_RESTRICT heavy_row = &_heavy_matrix[_heavy_pitch * heavy_row_i + heavy_col_j];

                    // For each heavy column:
                    for (; ge_column_j <= pivot_i; ++ge_column_j)
                    {
                        const uint8_t code_value = *heavy_row++;

                        // If zero:
                        if (0 == code_value) {
                            continue; // Skip it
                        }

                        CAT_DEBUG_ASSERT(_ge_col_map[ge_column_j] < _recovery_rows);
                        const uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * _ge_col_map[ge_column_j];

                        // Back-substitute
                        gf256_muladd_mem(dest, code_value, src, _block_bytes);

                        CAT_IF_ROWOP(if (code_value == 1) ++rowops; else ++heavyops;)
                    } // next column in row
                } // next pivot in window
            } // end if contains heavy

            // Only add window table entries for rows under this limit
            const uint16_t window_row_limit = (pivot_i >= first_heavy_column) ? first_heavy_row : 0x7fff;

            const uint32_t first_word = backsub_i >> 6;
            const uint32_t shift0 = backsub_i & 63;
            const uint32_t last_word = pivot_i >> 6;
            const uint16_t * GF256_RESTRICT pivot_row = _pivots;

            // If not straddling words:
            if (first_word == last_word)
            {
                // For each pivot row:
                for (uint16_t above_pivot_i = 0; above_pivot_i < backsub_i; ++above_pivot_i)
                {
                    const unsigned ge_row_k = *pivot_row++;

                    // If pivot row is heavy:
                    if (ge_row_k >= window_row_limit) {
                        continue; // Skip it
                    }

                    // Calculate window bits
                    const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + first_word + _ge_pitch * ge_row_k;
                    const uint32_t win_bits = (uint32_t)(ge_row[0] >> shift0) & (win_lim - 1);

                    // If any XOR needs to be performed:
                    if (win_bits != 0)
                    {
                        CAT_IF_DUMP(cout << "Adding window table " << win_bits << " to pivot " << above_pivot_i << endl;)

                        CAT_DEBUG_ASSERT(_ge_col_map[above_pivot_i] < _recovery_rows);
                        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[above_pivot_i];

                        // Back-substitute
                        gf256_add_mem(dest, win_table[win_bits], _block_bytes);

                        CAT_IF_ROWOP(++rowops;)
                    }
                }
            }
            else // Rare: Straddling case
            {
                const unsigned shift1 = 64 - shift0;

                // For each pivot row,
                for (uint16_t above_pivot_i = 0; above_pivot_i < backsub_i; ++above_pivot_i)
                {
                    const unsigned ge_row_k = *pivot_row++;

                    // If pivot row is heavy:
                    if (ge_row_k >= window_row_limit) {
                        continue; // Skip it
                    }

                    // Calculate window bits
                    const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + first_word + _ge_pitch * ge_row_k;
                    const unsigned win_bits = ( (uint32_t)(ge_row[0] >> shift0) | (uint32_t)(ge_row[1] << shift1) ) & (win_lim - 1);

                    // If any XOR needs to be performed:
                    if (win_bits != 0)
                    {
                        CAT_IF_DUMP(cout << "Adding window table " << win_bits << " to pivot " << above_pivot_i << endl;)

                        CAT_DEBUG_ASSERT(_ge_col_map[above_pivot_i] < _recovery_rows);
                        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[above_pivot_i];

                        // Back-substitute
                        gf256_add_mem(dest, win_table[win_bits], _block_bytes);

                        CAT_IF_ROWOP(++rowops;)
                    }
                }
            }

            // If column index falls below window size:
            pivot_i -= w;
            if (pivot_i < next_check_i)
            {
                if (pivot_i >= CAT_ABOVE_WIN_THRESH_6) {
                    w = 6;
                    next_check_i = CAT_ABOVE_WIN_THRESH_6;
                }
                else if (pivot_i >= CAT_ABOVE_WIN_THRESH_5) {
                    w = 5;
                    next_check_i = CAT_ABOVE_WIN_THRESH_5;
                }
                else if (pivot_i >= CAT_ABOVE_WIN_THRESH_4) {
                    w = 4;
                    next_check_i = CAT_ABOVE_WIN_THRESH_4;
                }
                else {
                    break;
                }

                // Update window limit
                win_lim = 1 << w;
            }
        } // next window
    } // end if windowed
#endif // CAT_WINDOWED_BACKSUB

    uint64_t ge_mask = (uint64_t)1 << (pivot_i & 63);

    // For each remaining pivot:
    for (;;)
    {
        // Calculate source
        CAT_DEBUG_ASSERT(_ge_col_map[pivot_i] < _recovery_rows);
        uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i];

        const uint16_t ge_row_i = _pivots[pivot_i];

        // If diagonal element is heavy:
        if (ge_row_i >= first_heavy_row &&
            pivot_i >= first_heavy_column)
        {
            // Look up row value
            CAT_DEBUG_ASSERT(ge_row_i >= first_heavy_row);
            const unsigned heavy_row_i = ge_row_i - first_heavy_row;
            CAT_DEBUG_ASSERT(pivot_i >= first_heavy_column);
            const unsigned heavy_col_i = pivot_i - first_heavy_column;
            CAT_DEBUG_ASSERT(heavy_col_i < _heavy_columns);
            CAT_DEBUG_ASSERT(heavy_row_i < _heavy_rows);
            const uint8_t code_value = _heavy_matrix[_heavy_pitch * heavy_row_i + heavy_col_i];

            // Normalize code value, setting it to 1 (implicitly nonzero)
            if (code_value != 1) {
                gf256_div_mem(src, src, code_value, _block_bytes);
                CAT_IF_ROWOP(++heavyops;)
            }

            CAT_IF_DUMP(cout << "Normalized diagonal for heavy pivot " << pivot_i << endl;)
        }

        CAT_IF_DUMP(cout << "Pivot " << pivot_i << "[" << (unsigned)src[0] << "]:";)

        const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + (pivot_i >> 6);

        // For each pivot row above it:
        for (unsigned ge_up_i = 0; ge_up_i < pivot_i; ++ge_up_i)
        {
            const uint16_t up_row_i = _pivots[ge_up_i];

            // If element is heavy:
            if (up_row_i >= first_heavy_row &&
                ge_up_i >= first_heavy_column)
            {
                const unsigned heavy_row_i = up_row_i - first_heavy_row;
                const unsigned heavy_col_i = pivot_i - first_heavy_column;
                const uint8_t code_value = _heavy_matrix[_heavy_pitch * heavy_row_i + heavy_col_i];

                // If column is zero:
                if (!code_value) {
                    continue; // Skip it
                }

                CAT_DEBUG_ASSERT(_ge_col_map[ge_up_i] < _recovery_rows);
                uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[ge_up_i];

                // Back-substitute
                gf256_muladd_mem(dest, code_value, src, _block_bytes);

                CAT_IF_ROWOP(if (code_value == 1) {
                    ++rowops;
                }
                else {
                    ++heavyops;
                })
                CAT_IF_DUMP(cout << " h" << up_row_i;)
            }
            else
            {
                // If bit is set in that row,
                if (ge_row[_ge_pitch * up_row_i] & ge_mask)
                {
                    CAT_DEBUG_ASSERT(_ge_col_map[ge_up_i] < _recovery_rows);
                    uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[ge_up_i];

                    // Back-substitute
                    gf256_add_mem(dest, src, _block_bytes);

                    CAT_IF_ROWOP(++rowops;)
                    CAT_IF_DUMP(cout << " " << up_row_i;)
                }
            }
        } // next pivot above

        if (pivot_i <= 0) {
            break;
        }
        --pivot_i;

        ge_mask = CAT_ROR64(ge_mask, 1);

        CAT_IF_DUMP(cout << endl;)
    }

    CAT_IF_ROWOP(cout << "BackSubstituteAboveDiagonal used " << rowops << " row ops = " << rowops / (double)_block_count << "*N and " << heavyops << " heavy ops" << endl;)
}